

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

MSize lj_ccallback_ptr2slot(CTState *cts,void *p)

{
  ulong uVar1;
  long in_RSI;
  MSize ofs_00;
  long in_RDI;
  MSize slot;
  uintptr_t ofs;
  MSize local_4;
  
  uVar1 = in_RSI - *(long *)(in_RDI + 0xb0);
  if ((0xfff < uVar1) ||
     (ofs_00 = (MSize)uVar1, local_4 = CALLBACK_OFS2SLOT(ofs_00),
     (local_4 >> 5) * 0xc + 8 + local_4 * 4 != ofs_00)) {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

MSize lj_ccallback_ptr2slot(CTState *cts, void *p)
{
  uintptr_t ofs = (uintptr_t)((uint8_t *)p -(uint8_t *)cts->cb.mcode);
  if (ofs < CALLBACK_MCODE_SIZE) {
    MSize slot = CALLBACK_OFS2SLOT((MSize)ofs);
    if (CALLBACK_SLOT2OFS(slot) == (MSize)ofs)
      return slot;
  }
  return ~0u;  /* Not a known callback function pointer. */
}